

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenDebugStreamWrite
          (InstDebugPrintfPass *this,uint32_t shader_id,uint32_t instruction_idx_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *validation_ids,
          InstructionBuilder *builder)

{
  initializer_list<unsigned_int> __l;
  uint32_t result_type;
  uint32_t function;
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  const_iterator local_70;
  allocator<unsigned_int> local_61;
  uint32_t local_60;
  uint32_t local_5c;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  uint32_t val_id_cnt;
  InstructionBuilder *builder_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *validation_ids_local;
  uint32_t instruction_idx_id_local;
  uint32_t shader_id_local;
  InstDebugPrintfPass *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(validation_ids);
  args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint32_t)sVar1;
  local_58 = &local_60;
  local_50 = 2;
  local_60 = shader_id;
  local_5c = instruction_idx_id;
  std::allocator<unsigned_int>::allocator(&local_61);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__l,&local_61);
  std::allocator<unsigned_int>::~allocator(&local_61);
  local_78._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_70,&local_78);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(validation_ids);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(validation_ids);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_48,local_70,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  result_type = InstrumentPass::GetVoidId(&this->super_InstrumentPass);
  function = GetStreamWriteFunctionId
                       (this,args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  InstructionBuilder::AddFunctionCall
            (builder,result_type,function,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void InstDebugPrintfPass::GenDebugStreamWrite(
    uint32_t shader_id, uint32_t instruction_idx_id,
    const std::vector<uint32_t>& validation_ids, InstructionBuilder* builder) {
  // Call debug output function. Pass func_idx, instruction_idx and
  // validation ids as args.
  uint32_t val_id_cnt = static_cast<uint32_t>(validation_ids.size());
  std::vector<uint32_t> args = {shader_id, instruction_idx_id};
  (void)args.insert(args.end(), validation_ids.begin(), validation_ids.end());
  (void)builder->AddFunctionCall(GetVoidId(),
                                 GetStreamWriteFunctionId(val_id_cnt), args);
}